

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

GLvoid __thiscall glcts::anon_unknown_0::GatherBase::CreateTextureCube(GatherBase *this)

{
  float x_;
  float y_;
  float z_;
  GLenum target;
  GLint level;
  GLenum width;
  bool bVar1;
  GLenum internal_format_00;
  GLenum format_00;
  int iVar2;
  reference pixels_00;
  float *pfVar3;
  float *local_138;
  int local_e4;
  int j_1;
  Vec4 *packedData;
  Vec4 depthData;
  Vec4 data [4];
  int local_80;
  int j;
  allocator<tcu::Vector<float,_4>_> local_69;
  Vector<float,_4> local_68;
  undefined1 local_58 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixels;
  GLenum GStack_38;
  int i;
  GLenum faces [6];
  GLint size;
  GLint csize;
  GLenum format;
  GLenum internal_format;
  GatherBase *this_local;
  
  internal_format_00 =
       (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])();
  format_00 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x22])();
  faces[5] = 0x20;
  faces[4] = 0x20;
  _GStack_38 = 0x851600008515;
  faces[0] = 0x8517;
  faces[1] = 0x8518;
  faces[2] = 0x8519;
  faces[3] = 0x851a;
  glu::CallLogWrapper::glGenTextures
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->tex);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8513,
             this->tex);
  pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  for (; 0 < (int)faces[4]; faces[4] = (int)faces[4] / 2) {
    iVar2 = faces[4] * faces[4];
    tcu::Vector<float,_4>::Vector(&local_68,1.0);
    std::allocator<tcu::Vector<float,_4>_>::allocator(&local_69);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_58,
               (long)iVar2,&local_68,&local_69);
    std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_69);
    for (local_80 = 0; width = faces[4],
        level = pixels.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_, local_80 < 6;
        local_80 = local_80 + 1) {
      target = (&GStack_38)[local_80];
      pixels_00 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)local_58,0);
      glu::CallLogWrapper::glTexImage2D
                (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,target
                 ,level,internal_format_00,width,width,0,format_00,0x1406,pixels_00);
    }
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_58);
    pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(depthData.m_data + 2),0.75,0.8125,0.875,0.9375)
  ;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data[0].m_data + 2),0.5,0.5625,0.625,0.6875);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data[1].m_data + 2),0.0,0.0625,0.125,0.1875);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data[2].m_data + 2),0.25,0.3125,0.375,0.4375);
  pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(depthData.m_data + 2),0);
  x_ = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(data[0].m_data + 2),0);
  y_ = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(data[1].m_data + 2),0);
  z_ = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(data[2].m_data + 2),0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&packedData,x_,y_,z_,*pfVar3);
  if (format_00 == 0x1902) {
    local_138 = (float *)&packedData;
  }
  else {
    local_138 = depthData.m_data + 2;
  }
  for (local_e4 = 0; local_e4 < 6; local_e4 = local_e4 + 1) {
    glu::CallLogWrapper::glTexSubImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               (&GStack_38)[local_e4],0,0x16,0x19,2,2,format_00,0x1406,local_138);
    glu::CallLogWrapper::glTexSubImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               (&GStack_38)[local_e4],0,0x10,10,1,1,format_00,0x1406,depthData.m_data + 2);
    glu::CallLogWrapper::glTexSubImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               (&GStack_38)[local_e4],0,0xb,2,1,1,format_00,0x1406,data[0].m_data + 2);
    glu::CallLogWrapper::glTexSubImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               (&GStack_38)[local_e4],0,0x18,0xd,1,1,format_00,0x1406,data[1].m_data + 2);
    glu::CallLogWrapper::glTexSubImage2D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               (&GStack_38)[local_e4],0,9,0xe,1,1,format_00,0x1406,data[2].m_data + 2);
  }
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8513,
             0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8513,
             0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8513,
             0x8072,0x812f);
  bVar1 = IsFloatingPointTexture(this,internal_format_00);
  if (bVar1) {
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8513,
               0x2800,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8513,
               0x2801,0x2700);
  }
  return;
}

Assistant:

virtual GLvoid CreateTextureCube()
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= Format();
		const GLint csize			= 32;
		GLint		size			= csize;

		const GLenum faces[6] = { GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
								  GL_TEXTURE_CUBE_MAP_POSITIVE_Y, GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
								  GL_TEXTURE_CUBE_MAP_POSITIVE_Z, GL_TEXTURE_CUBE_MAP_NEGATIVE_Z };

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			std::vector<Vec4> pixels(size * size, Vec4(1.0));
			for (int j = 0; j < 6; ++j)
			{
				glTexImage2D(faces[j], i, internal_format, size, size, 0, format, GL_FLOAT, &pixels[0]);
			}
		}

		Vec4 data[4] = { Vec4(12. / 16, 13. / 16, 14. / 16, 15. / 16), Vec4(8. / 16, 9. / 16, 10. / 16, 11. / 16),
						 Vec4(0. / 16, 1. / 16, 2. / 16, 3. / 16), Vec4(4. / 16, 5. / 16, 6. / 16, 7. / 16) };

		Vec4  depthData(data[0][0], data[1][0], data[2][0], data[3][0]);
		Vec4* packedData = (format == GL_DEPTH_COMPONENT) ? &depthData : data;

		for (int j = 0; j < 6; ++j)
		{
			glTexSubImage2D(faces[j], 0, 22, 25, 2, 2, format, GL_FLOAT, packedData);
			glTexSubImage2D(faces[j], 0, 16, 10, 1, 1, format, GL_FLOAT, data + 0);
			glTexSubImage2D(faces[j], 0, 11, 2, 1, 1, format, GL_FLOAT, data + 1);
			glTexSubImage2D(faces[j], 0, 24, 13, 1, 1, format, GL_FLOAT, data + 2);
			glTexSubImage2D(faces[j], 0, 9, 14, 1, 1, format, GL_FLOAT, data + 3);
		}

		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);

		if (IsFloatingPointTexture(internal_format))
		{
			glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
		}
	}